

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O3

void ON_Internal_RecordErrorEvent(ON_ErrorEvent *error_event,bool bPrint)

{
  Type TVar1;
  bool bVar2;
  char *sErrorMessage;
  uint message_type;
  ON_String *this;
  ON_String s;
  ON_String local_30;
  ON_String local_28;
  
  if (ON_ACTIVE_ERROR_LOG != (ON_ErrorLog *)0x0) {
    (*ON_ACTIVE_ERROR_LOG->_vptr_ON_ErrorLog[2])(ON_ACTIVE_ERROR_LOG,error_event);
  }
  if (!bPrint || ON_DEBUG_ERROR_MESSAGE_OPTION == 0) {
    return;
  }
  TVar1 = error_event->m_event_type;
  ON_String::ON_String(&local_28);
  if (TVar1 == Warning) {
    if (ON_WARNING_COUNT == 0x20) {
      ON_String::FormatToString
                ((char *)&local_30,"ON_WARNING # %d: ... suspending warning messages.",0x20);
      ON_String::operator=(&local_28,&local_30);
LAB_0045bb74:
      this = &local_30;
      goto LAB_0045bc1f;
    }
    ON_String::FormatToString(&stack0xffffffffffffffe8,"ON_WARNING # %d: ");
    ON_ErrorEvent::ToString((ON_ErrorEvent *)&stack0xffffffffffffffe0);
    ON_String::operator+(&local_30,(ON_String *)&stack0xffffffffffffffe8);
    ON_String::operator=(&local_28,&local_30);
  }
  else {
    if (ON_ERROR_COUNT == 0x20) {
      ON_String::FormatToString
                ((char *)&local_30,"ON_ERROR # %d: ... suspending error messages.",0x20);
      ON_String::operator=(&local_28,&local_30);
      goto LAB_0045bb74;
    }
    ON_String::FormatToString(&stack0xffffffffffffffe8,"ON_ERROR # %d: ");
    ON_ErrorEvent::ToString((ON_ErrorEvent *)&stack0xffffffffffffffe0);
    ON_String::operator+(&local_30,(ON_String *)&stack0xffffffffffffffe8);
    ON_String::operator=(&local_28,&local_30);
  }
  ON_String::~ON_String(&local_30);
  ON_String::~ON_String((ON_String *)&stack0xffffffffffffffe0);
  this = (ON_String *)&stack0xffffffffffffffe8;
LAB_0045bc1f:
  ON_String::~ON_String(this);
  bVar2 = ON_String::IsNotEmpty(&local_28);
  if (bVar2) {
    sErrorMessage = ON_String::operator_cast_to_char_(&local_28);
    message_type = 2;
    if (TVar1 != Assert) {
      message_type = (uint)(TVar1 == Error);
    }
    ON_ErrorMessage(message_type,sErrorMessage);
  }
  ON_String::~ON_String(&local_28);
  return;
}

Assistant:

static void ON_Internal_RecordErrorEvent(
  const ON_ErrorEvent& error_event,
  bool bPrint
  )
{
  if (nullptr != ON_ACTIVE_ERROR_LOG)
    ON_ACTIVE_ERROR_LOG->Append(error_event);


  if ( 0 == ON_DEBUG_ERROR_MESSAGE_OPTION )
    return;

  if (false == bPrint)
    return;

  
  const ON_ErrorEvent::Type error_type = error_event.EventType();
  ON_String s;      
  if ( ON_ErrorEvent::Type::Warning == error_type )
  {
    if (ON_WARNING_COUNT == ON_MAX_ERROR_MESSAGE_COUNT)
      s = ON_String::FormatToString("ON_WARNING # %d: ... suspending warning messages.", ON_WARNING_COUNT);
    else
      s = ON_String::FormatToString("ON_WARNING # %d: ", ON_WARNING_COUNT) + error_event.ToString();
  }
  else
  {
    if (ON_ERROR_COUNT == ON_MAX_ERROR_MESSAGE_COUNT)
      s = ON_String::FormatToString("ON_ERROR # %d: ... suspending error messages.", ON_ERROR_COUNT);
    else
      s = ON_String::FormatToString("ON_ERROR # %d: ", ON_ERROR_COUNT) + error_event.ToString();
  }

  if ( s.IsNotEmpty() )
  {
    int obsolete_type;
    switch (error_type)
    {
    case ON_ErrorEvent::Type::Unset:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::Warning:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::Error:
      obsolete_type = 1;
      break;
    case ON_ErrorEvent::Type::Assert:
      obsolete_type = 2;
      break;
    case ON_ErrorEvent::Type::Custom:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::SubDError:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::NotValid:
      obsolete_type = 0;
      break;
    default:
      obsolete_type = 0;
      break;
    }
    ON_ErrorMessage(obsolete_type,static_cast<const char*>(s));
  }
}